

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

QAction * __thiscall
QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon,QObject *receiver,char *member)

{
  QAction *this_00;
  QString local_48;
  QObject local_30 [8];
  
  this_00 = (QAction *)operator_new(0x10);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  QAction::QAction(this_00,icon,&local_48,(QObject *)this);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  QObject::connect(local_30,(char *)this_00,(QObject *)"2triggered(bool)",(char *)receiver,
                   (ConnectionType)member);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QWidget::addAction((QAction *)this);
  return this_00;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon,
	const QObject * receiver, const char * member )
{
	QAction * action = new QAction( icon, QString(), this );
	QObject::connect( action, SIGNAL( triggered(bool) ), receiver, member );
	addAction( action );
	return action;
}